

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O1

void __thiscall cfd::core::Address::SetAddressType(Address *this,AddressType addr_type)

{
  if (1 < this->addr_type_ - kP2shP2wshAddress || addr_type != kP2shAddress) {
    this->addr_type_ = addr_type;
  }
  return;
}

Assistant:

void Address::SetAddressType(AddressType addr_type) {
  if ((addr_type_ == kP2shP2wshAddress) ||
      (addr_type_ == kP2shP2wpkhAddress)) {
    if (addr_type != kP2shAddress) {
      addr_type_ = addr_type;
    }
  } else {
    addr_type_ = addr_type;
  }
}